

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O0

void sat_solver3_set_var_activity(sat_solver3 *s,int *pVars,int nVars)

{
  word wVar1;
  int local_28;
  int local_20;
  int iVar;
  int i;
  int nVars_local;
  int *pVars_local;
  sat_solver3 *s_local;
  
  if (s->VarActType == 1) {
    for (local_20 = 0; local_20 < s->size; local_20 = local_20 + 1) {
      s->activity[local_20] = 0;
    }
    wVar1 = Abc_Dbl2Word(1.0);
    s->var_inc = wVar1;
    for (local_20 = 0; local_20 < nVars; local_20 = local_20 + 1) {
      if (pVars == (int *)0x0) {
        local_28 = local_20;
      }
      else {
        local_28 = pVars[local_20];
      }
      wVar1 = Abc_Dbl2Word((double)(nVars - local_20));
      s->activity[local_28] = wVar1;
      order_update(s,local_28);
    }
    return;
  }
  __assert_fail("s->VarActType == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver3.c"
                ,0xdb,"void sat_solver3_set_var_activity(sat_solver3 *, int *, int)");
}

Assistant:

void sat_solver3_set_var_activity(sat_solver3* s, int * pVars, int nVars) 
{
    int i;
    assert( s->VarActType == 1 );
    for (i = 0; i < s->size; i++)
        s->activity[i] = 0;
    s->var_inc = Abc_Dbl2Word(1);
    for ( i = 0; i < nVars; i++ )
    {
        int iVar = pVars ? pVars[i] : i;
        s->activity[iVar] = Abc_Dbl2Word(nVars-i);
        order_update( s, iVar );
    }
}